

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack8.h
# Opt level: O0

void ncnn::pooling3x3s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  float *pfVar15;
  long in_RSI;
  long in_RDI;
  __m256 _max1;
  __m256 _max0;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _max11_1;
  __m256 _max10_1;
  __m256 _r24_1;
  __m256 _r23_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _max01_1;
  __m256 _max00_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _max31;
  __m256 _max30;
  __m256 _r28;
  __m256 _r27;
  __m256 _r18;
  __m256 _r17;
  __m256 _r08;
  __m256 _r07;
  __m256 _max21;
  __m256 _max20;
  __m256 _r26;
  __m256 _r25;
  __m256 _r16;
  __m256 _r15;
  __m256 _r06;
  __m256 _r05;
  __m256 _max11;
  __m256 _max10;
  __m256 _r24;
  __m256 _r23;
  __m256 _r14;
  __m256 _r13;
  __m256 _r04;
  __m256 _r03;
  __m256 _max01;
  __m256 _max00;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  int i;
  float *r2;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  undefined8 local_1aa0;
  undefined8 uVar16;
  Mat *this;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  int local_1270;
  int local_126c;
  undefined1 (*local_1268) [32];
  undefined1 (*local_1260) [32];
  undefined1 (*local_1258) [32];
  Mat local_1240;
  float *local_11f8;
  Mat local_11f0;
  int local_11a8;
  int local_11a4;
  int local_11a0;
  int local_119c;
  int local_1198;
  int local_1194;
  undefined1 (*local_1178) [32];
  undefined1 (*local_1170) [32];
  undefined1 (*local_1168) [32];
  undefined1 (*local_1160) [32];
  undefined1 (*local_1158) [32];
  undefined1 (*local_1150) [32];
  undefined1 (*local_1148) [32];
  undefined1 (*local_1140) [32];
  undefined1 (*local_1138) [32];
  undefined1 (*local_1130) [32];
  undefined1 (*local_1128) [32];
  undefined1 (*local_1120) [32];
  undefined1 (*local_1118) [32];
  undefined1 (*local_1110) [32];
  undefined1 (*local_1108) [32];
  undefined1 (*local_1100) [32];
  undefined1 (*local_10f8) [32];
  undefined1 (*local_10f0) [32];
  undefined1 (*local_10e8) [32];
  undefined1 (*local_10e0) [32];
  undefined1 (*local_10d8) [32];
  undefined1 (*local_10d0) [32];
  undefined1 (*local_10c8) [32];
  undefined1 (*local_10c0) [32];
  undefined1 (*local_10b8) [32];
  undefined1 (*local_10b0) [32];
  undefined1 (*local_10a8) [32];
  undefined1 (*local_10a0) [32];
  undefined1 (*local_1098) [32];
  undefined1 (*local_1090) [32];
  undefined1 (*local_1088) [32];
  undefined1 (*local_1080) [32];
  undefined1 (*local_1078) [32];
  undefined1 (*local_1070) [32];
  undefined1 (*local_1068) [32];
  undefined1 (*local_1060) [32];
  undefined1 (*local_1058) [32];
  undefined1 (*local_1050) [32];
  undefined1 (*local_1048) [32];
  undefined1 (*local_1040) [32];
  undefined1 (*local_1038) [32];
  undefined1 (*local_1030) [32];
  undefined1 (*local_1028) [32];
  undefined1 (*local_1020) [32];
  undefined1 (*local_1018) [32];
  undefined1 (*local_1010) [32];
  undefined1 (*local_1008) [32];
  undefined1 (*local_1000) [32];
  undefined1 (*local_ff8) [32];
  undefined1 (*local_ff0) [32];
  undefined1 (*local_fe8) [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  float *local_1a8;
  undefined1 local_1a0 [32];
  float *local_168;
  undefined1 local_160 [32];
  float *local_128;
  undefined1 local_120 [32];
  float *local_e8;
  undefined1 local_e0 [32];
  float *local_a8;
  undefined1 local_a0 [32];
  float *local_68;
  undefined1 local_60 [32];
  float *local_38;
  
  local_1194 = *(int *)(in_RDI + 0x2c);
  local_1198 = *(int *)(in_RDI + 0x38);
  local_119c = *(int *)(in_RSI + 0x2c);
  local_11a0 = *(int *)(in_RSI + 0x30);
  local_11a4 = (local_1194 * 2 + local_119c * -2) * 8;
  for (local_11a8 = 0; local_11a8 < local_1198; local_11a8 = local_11a8 + 1) {
    Mat::channel(this,local_1aa0._12_4_);
    Mat::channel(this,local_1aa0._12_4_);
    pfVar15 = Mat::operator_cast_to_float_(&local_1240);
    Mat::~Mat((Mat *)0x4c4a7c);
    local_11f8 = pfVar15;
    local_1258 = (undefined1 (*) [32])Mat::row(&local_11f0,0);
    local_1260 = (undefined1 (*) [32])Mat::row(&local_11f0,1);
    local_1268 = (undefined1 (*) [32])Mat::row(&local_11f0,2);
    for (local_126c = 0; local_126c < local_11a0; local_126c = local_126c + 1) {
      for (local_1270 = 0; local_1270 + 3 < local_119c; local_1270 = local_1270 + 4) {
        local_fe8 = local_1258;
        local_200 = *(undefined8 *)*local_1258;
        uStack_1f8 = *(undefined8 *)(*local_1258 + 8);
        uStack_1f0 = *(undefined8 *)(*local_1258 + 0x10);
        uStack_1e8 = *(undefined8 *)(*local_1258 + 0x18);
        local_ff0 = local_1258 + 1;
        local_220 = *(undefined8 *)*local_ff0;
        uStack_218 = *(undefined8 *)(local_1258[1] + 8);
        uStack_210 = *(undefined8 *)(local_1258[1] + 0x10);
        uStack_208 = *(undefined8 *)(local_1258[1] + 0x18);
        local_ff8 = local_1258 + 2;
        local_460 = *(undefined8 *)*local_ff8;
        uStack_458 = *(undefined8 *)(local_1258[2] + 8);
        uStack_450 = *(undefined8 *)(local_1258[2] + 0x10);
        uStack_448 = *(undefined8 *)(local_1258[2] + 0x18);
        auVar5 = *local_ff8;
        local_1000 = local_1260;
        local_2a0 = *(undefined8 *)*local_1260;
        uStack_298 = *(undefined8 *)(*local_1260 + 8);
        uStack_290 = *(undefined8 *)(*local_1260 + 0x10);
        uStack_288 = *(undefined8 *)(*local_1260 + 0x18);
        local_1008 = local_1260 + 1;
        local_2e0 = *(undefined8 *)*local_1008;
        uStack_2d8 = *(undefined8 *)(local_1260[1] + 8);
        uStack_2d0 = *(undefined8 *)(local_1260[1] + 0x10);
        uStack_2c8 = *(undefined8 *)(local_1260[1] + 0x18);
        local_1010 = local_1260 + 2;
        local_500 = *(undefined8 *)*local_1010;
        uStack_4f8 = *(undefined8 *)(local_1260[2] + 8);
        uStack_4f0 = *(undefined8 *)(local_1260[2] + 0x10);
        uStack_4e8 = *(undefined8 *)(local_1260[2] + 0x18);
        auVar8 = *local_1010;
        local_1018 = local_1268;
        local_320 = *(undefined8 *)*local_1268;
        uStack_318 = *(undefined8 *)(*local_1268 + 8);
        uStack_310 = *(undefined8 *)(*local_1268 + 0x10);
        uStack_308 = *(undefined8 *)(*local_1268 + 0x18);
        local_1020 = local_1268 + 1;
        local_360 = *(undefined8 *)*local_1020;
        uStack_358 = *(undefined8 *)(local_1268[1] + 8);
        uStack_350 = *(undefined8 *)(local_1268[1] + 0x10);
        uStack_348 = *(undefined8 *)(local_1268[1] + 0x18);
        local_1028 = local_1268 + 2;
        local_5a0 = *(undefined8 *)*local_1028;
        uStack_598 = *(undefined8 *)(local_1268[2] + 8);
        uStack_590 = *(undefined8 *)(local_1268[2] + 0x10);
        uStack_588 = *(undefined8 *)(local_1268[2] + 0x18);
        auVar11 = *local_1028;
        auVar1 = vmaxps_avx(*local_1258,*local_ff0);
        local_13c0 = auVar1._0_8_;
        local_240 = local_13c0;
        uStack_13b8 = auVar1._8_8_;
        uStack_238 = uStack_13b8;
        uStack_13b0 = auVar1._16_8_;
        uStack_230 = uStack_13b0;
        uStack_13a8 = auVar1._24_8_;
        uStack_228 = uStack_13a8;
        auVar1 = vmaxps_avx(auVar1,*local_ff8);
        local_13c0 = auVar1._0_8_;
        local_280 = local_13c0;
        uStack_13b8 = auVar1._8_8_;
        uStack_278 = uStack_13b8;
        uStack_13b0 = auVar1._16_8_;
        uStack_270 = uStack_13b0;
        uStack_13a8 = auVar1._24_8_;
        uStack_268 = uStack_13a8;
        auVar1 = vmaxps_avx(auVar1,*local_1260);
        local_13c0 = auVar1._0_8_;
        local_2c0 = local_13c0;
        uStack_13b8 = auVar1._8_8_;
        uStack_2b8 = uStack_13b8;
        uStack_13b0 = auVar1._16_8_;
        uStack_2b0 = uStack_13b0;
        uStack_13a8 = auVar1._24_8_;
        uStack_2a8 = uStack_13a8;
        auVar1 = vmaxps_avx(auVar1,*local_1008);
        auVar2 = vmaxps_avx(*local_1010,*local_1268);
        local_13e0 = auVar2._0_8_;
        local_340 = local_13e0;
        uStack_13d8 = auVar2._8_8_;
        uStack_338 = uStack_13d8;
        uStack_13d0 = auVar2._16_8_;
        uStack_330 = uStack_13d0;
        uStack_13c8 = auVar2._24_8_;
        uStack_328 = uStack_13c8;
        auVar2 = vmaxps_avx(auVar2,*local_1020);
        local_13e0 = auVar2._0_8_;
        local_380 = local_13e0;
        uStack_13d8 = auVar2._8_8_;
        uStack_378 = uStack_13d8;
        uStack_13d0 = auVar2._16_8_;
        uStack_370 = uStack_13d0;
        uStack_13c8 = auVar2._24_8_;
        uStack_368 = uStack_13c8;
        auVar2 = vmaxps_avx(auVar2,*local_1028);
        local_1030 = local_1258 + 3;
        local_400 = *(undefined8 *)*local_1030;
        uStack_3f8 = *(undefined8 *)(local_1258[3] + 8);
        uStack_3f0 = *(undefined8 *)(local_1258[3] + 0x10);
        uStack_3e8 = *(undefined8 *)(local_1258[3] + 0x18);
        auVar3 = *local_1030;
        local_1038 = local_1258 + 4;
        local_660 = *(undefined8 *)*local_1038;
        uStack_658 = *(undefined8 *)(local_1258[4] + 8);
        uStack_650 = *(undefined8 *)(local_1258[4] + 0x10);
        uStack_648 = *(undefined8 *)(local_1258[4] + 0x18);
        auVar12 = *local_1038;
        auVar4 = *local_1038;
        local_1040 = local_1260 + 3;
        local_4a0 = *(undefined8 *)*local_1040;
        uStack_498 = *(undefined8 *)(local_1260[3] + 8);
        uStack_490 = *(undefined8 *)(local_1260[3] + 0x10);
        uStack_488 = *(undefined8 *)(local_1260[3] + 0x18);
        auVar6 = *local_1040;
        local_1048 = local_1260 + 4;
        local_700 = *(undefined8 *)*local_1048;
        uStack_6f8 = *(undefined8 *)(local_1260[4] + 8);
        uStack_6f0 = *(undefined8 *)(local_1260[4] + 0x10);
        uStack_6e8 = *(undefined8 *)(local_1260[4] + 0x18);
        auVar13 = *local_1048;
        auVar7 = *local_1048;
        local_1050 = local_1268 + 3;
        local_520 = *(undefined8 *)*local_1050;
        uStack_518 = *(undefined8 *)(local_1268[3] + 8);
        uStack_510 = *(undefined8 *)(local_1268[3] + 0x10);
        uStack_508 = *(undefined8 *)(local_1268[3] + 0x18);
        auVar9 = *local_1050;
        local_1058 = local_1268 + 4;
        local_7a0 = *(undefined8 *)*local_1058;
        uStack_798 = *(undefined8 *)(local_1268[4] + 8);
        uStack_790 = *(undefined8 *)(local_1268[4] + 0x10);
        uStack_788 = *(undefined8 *)(local_1268[4] + 0x18);
        auVar14 = *local_1058;
        auVar10 = *local_1058;
        local_38 = local_11f8;
        local_13c0 = auVar1._0_8_;
        local_3c0 = local_13c0;
        uStack_13b8 = auVar1._8_8_;
        uStack_3b8 = uStack_13b8;
        uStack_13b0 = auVar1._16_8_;
        uStack_3b0 = uStack_13b0;
        uStack_13a8 = auVar1._24_8_;
        uStack_3a8 = uStack_13a8;
        local_13e0 = auVar2._0_8_;
        local_3e0 = local_13e0;
        uStack_13d8 = auVar2._8_8_;
        uStack_3d8 = uStack_13d8;
        uStack_13d0 = auVar2._16_8_;
        uStack_3d0 = uStack_13d0;
        uStack_13c8 = auVar2._24_8_;
        uStack_3c8 = uStack_13c8;
        local_60 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_11f8 = local_60._0_8_;
        *(undefined8 *)(local_11f8 + 2) = local_60._8_8_;
        *(undefined8 *)(local_11f8 + 4) = local_60._16_8_;
        *(undefined8 *)(local_11f8 + 6) = local_60._24_8_;
        auVar1 = vmaxps_avx(auVar3,auVar4);
        local_14c0 = auVar1._0_8_;
        local_440 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_438 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_430 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_428 = uStack_14a8;
        auVar1 = vmaxps_avx(auVar1,auVar5);
        local_14c0 = auVar1._0_8_;
        local_480 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_478 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_470 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_468 = uStack_14a8;
        auVar1 = vmaxps_avx(auVar1,auVar6);
        local_14c0 = auVar1._0_8_;
        local_4c0 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_4b8 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_4b0 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_4a8 = uStack_14a8;
        auVar1 = vmaxps_avx(auVar1,auVar7);
        auVar2 = vmaxps_avx(auVar8,auVar9);
        local_14c0 = auVar1._0_8_;
        local_540 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_538 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_530 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_528 = uStack_14a8;
        auVar1 = vmaxps_avx(auVar1,auVar10);
        local_14c0 = auVar1._0_8_;
        local_580 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_578 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_570 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_568 = uStack_14a8;
        auVar1 = vmaxps_avx(auVar1,auVar11);
        local_1060 = local_1258 + 5;
        local_600 = *(undefined8 *)*local_1060;
        uStack_5f8 = *(undefined8 *)(local_1258[5] + 8);
        uStack_5f0 = *(undefined8 *)(local_1258[5] + 0x10);
        uStack_5e8 = *(undefined8 *)(local_1258[5] + 0x18);
        auVar3 = *local_1060;
        local_1068 = local_1258 + 6;
        local_860 = *(undefined8 *)*local_1068;
        uStack_858 = *(undefined8 *)(local_1258[6] + 8);
        uStack_850 = *(undefined8 *)(local_1258[6] + 0x10);
        uStack_848 = *(undefined8 *)(local_1258[6] + 0x18);
        auVar9 = *local_1068;
        auVar4 = *local_1068;
        local_1070 = local_1260 + 5;
        local_6a0 = *(undefined8 *)*local_1070;
        uStack_698 = *(undefined8 *)(local_1260[5] + 8);
        uStack_690 = *(undefined8 *)(local_1260[5] + 0x10);
        uStack_688 = *(undefined8 *)(local_1260[5] + 0x18);
        auVar5 = *local_1070;
        local_1078 = local_1260 + 6;
        local_900 = *(undefined8 *)*local_1078;
        uStack_8f8 = *(undefined8 *)(local_1260[6] + 8);
        uStack_8f0 = *(undefined8 *)(local_1260[6] + 0x10);
        uStack_8e8 = *(undefined8 *)(local_1260[6] + 0x18);
        auVar10 = *local_1078;
        auVar6 = *local_1078;
        local_1080 = local_1268 + 5;
        local_720 = *(undefined8 *)*local_1080;
        uStack_718 = *(undefined8 *)(local_1268[5] + 8);
        uStack_710 = *(undefined8 *)(local_1268[5] + 0x10);
        uStack_708 = *(undefined8 *)(local_1268[5] + 0x18);
        auVar7 = *local_1080;
        local_1088 = local_1268 + 6;
        local_9a0 = *(undefined8 *)*local_1088;
        uStack_998 = *(undefined8 *)(local_1268[6] + 8);
        uStack_990 = *(undefined8 *)(local_1268[6] + 0x10);
        uStack_988 = *(undefined8 *)(local_1268[6] + 0x18);
        auVar11 = *local_1088;
        auVar8 = *local_1088;
        local_68 = local_11f8 + 8;
        local_14c0 = auVar1._0_8_;
        local_5c0 = local_14c0;
        uStack_14b8 = auVar1._8_8_;
        uStack_5b8 = uStack_14b8;
        uStack_14b0 = auVar1._16_8_;
        uStack_5b0 = uStack_14b0;
        uStack_14a8 = auVar1._24_8_;
        uStack_5a8 = uStack_14a8;
        local_14e0 = auVar2._0_8_;
        local_5e0 = local_14e0;
        uStack_14d8 = auVar2._8_8_;
        uStack_5d8 = uStack_14d8;
        uStack_14d0 = auVar2._16_8_;
        uStack_5d0 = uStack_14d0;
        uStack_14c8 = auVar2._24_8_;
        uStack_5c8 = uStack_14c8;
        local_a0 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_68 = local_a0._0_8_;
        *(undefined8 *)(local_11f8 + 10) = local_a0._8_8_;
        *(undefined8 *)(local_11f8 + 0xc) = local_a0._16_8_;
        *(undefined8 *)(local_11f8 + 0xe) = local_a0._24_8_;
        auVar1 = vmaxps_avx(auVar3,auVar4);
        local_15c0 = auVar1._0_8_;
        local_640 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_638 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_630 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_628 = uStack_15a8;
        auVar1 = vmaxps_avx(auVar1,auVar12);
        local_15c0 = auVar1._0_8_;
        local_680 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_678 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_670 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_668 = uStack_15a8;
        auVar1 = vmaxps_avx(auVar1,auVar5);
        local_15c0 = auVar1._0_8_;
        local_6c0 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_6b8 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_6b0 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_6a8 = uStack_15a8;
        auVar1 = vmaxps_avx(auVar1,auVar6);
        auVar2 = vmaxps_avx(auVar13,auVar7);
        local_15c0 = auVar1._0_8_;
        local_740 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_738 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_730 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_728 = uStack_15a8;
        auVar1 = vmaxps_avx(auVar1,auVar8);
        local_15c0 = auVar1._0_8_;
        local_780 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_778 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_770 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_768 = uStack_15a8;
        auVar1 = vmaxps_avx(auVar1,auVar14);
        local_1090 = local_1258 + 7;
        local_800 = *(undefined8 *)*local_1090;
        uStack_7f8 = *(undefined8 *)(local_1258[7] + 8);
        uStack_7f0 = *(undefined8 *)(local_1258[7] + 0x10);
        uStack_7e8 = *(undefined8 *)(local_1258[7] + 0x18);
        auVar3 = *local_1090;
        local_1098 = local_1258 + 8;
        local_820 = *(undefined8 *)*local_1098;
        uStack_818 = *(undefined8 *)(local_1258[8] + 8);
        uStack_810 = *(undefined8 *)(local_1258[8] + 0x10);
        uStack_808 = *(undefined8 *)(local_1258[8] + 0x18);
        auVar4 = *local_1098;
        local_10a0 = local_1260 + 7;
        local_8a0 = *(undefined8 *)*local_10a0;
        uStack_898 = *(undefined8 *)(local_1260[7] + 8);
        uStack_890 = *(undefined8 *)(local_1260[7] + 0x10);
        uStack_888 = *(undefined8 *)(local_1260[7] + 0x18);
        auVar5 = *local_10a0;
        local_10a8 = local_1260 + 8;
        local_8e0 = *(undefined8 *)*local_10a8;
        uStack_8d8 = *(undefined8 *)(local_1260[8] + 8);
        uStack_8d0 = *(undefined8 *)(local_1260[8] + 0x10);
        uStack_8c8 = *(undefined8 *)(local_1260[8] + 0x18);
        auVar6 = *local_10a8;
        local_10b0 = local_1268 + 7;
        local_920 = *(undefined8 *)*local_10b0;
        uStack_918 = *(undefined8 *)(local_1268[7] + 8);
        uStack_910 = *(undefined8 *)(local_1268[7] + 0x10);
        uStack_908 = *(undefined8 *)(local_1268[7] + 0x18);
        auVar7 = *local_10b0;
        local_10b8 = local_1268 + 8;
        local_960 = *(undefined8 *)*local_10b8;
        uStack_958 = *(undefined8 *)(local_1268[8] + 8);
        uStack_950 = *(undefined8 *)(local_1268[8] + 0x10);
        uStack_948 = *(undefined8 *)(local_1268[8] + 0x18);
        auVar8 = *local_10b8;
        local_a8 = local_11f8 + 0x10;
        local_15c0 = auVar1._0_8_;
        local_7c0 = local_15c0;
        uStack_15b8 = auVar1._8_8_;
        uStack_7b8 = uStack_15b8;
        uStack_15b0 = auVar1._16_8_;
        uStack_7b0 = uStack_15b0;
        uStack_15a8 = auVar1._24_8_;
        uStack_7a8 = uStack_15a8;
        local_15e0 = auVar2._0_8_;
        local_7e0 = local_15e0;
        uStack_15d8 = auVar2._8_8_;
        uStack_7d8 = uStack_15d8;
        uStack_15d0 = auVar2._16_8_;
        uStack_7d0 = uStack_15d0;
        uStack_15c8 = auVar2._24_8_;
        uStack_7c8 = uStack_15c8;
        local_e0 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_a8 = local_e0._0_8_;
        *(undefined8 *)(local_11f8 + 0x12) = local_e0._8_8_;
        *(undefined8 *)(local_11f8 + 0x14) = local_e0._16_8_;
        *(undefined8 *)(local_11f8 + 0x16) = local_e0._24_8_;
        auVar1 = vmaxps_avx(auVar3,auVar4);
        local_16c0 = auVar1._0_8_;
        local_840 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_838 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_830 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_828 = uStack_16a8;
        auVar1 = vmaxps_avx(auVar1,auVar9);
        local_16c0 = auVar1._0_8_;
        local_880 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_878 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_870 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_868 = uStack_16a8;
        auVar1 = vmaxps_avx(auVar1,auVar5);
        local_16c0 = auVar1._0_8_;
        local_8c0 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_8b8 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_8b0 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_8a8 = uStack_16a8;
        auVar1 = vmaxps_avx(auVar1,auVar6);
        auVar2 = vmaxps_avx(auVar10,auVar7);
        local_16c0 = auVar1._0_8_;
        local_940 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_938 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_930 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_928 = uStack_16a8;
        auVar1 = vmaxps_avx(auVar1,auVar8);
        local_16c0 = auVar1._0_8_;
        local_980 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_978 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_970 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_968 = uStack_16a8;
        auVar1 = vmaxps_avx(auVar1,auVar11);
        local_e8 = local_11f8 + 0x18;
        local_16c0 = auVar1._0_8_;
        local_9c0 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_9b8 = uStack_16b8;
        uStack_16b0 = auVar1._16_8_;
        uStack_9b0 = uStack_16b0;
        uStack_16a8 = auVar1._24_8_;
        uStack_9a8 = uStack_16a8;
        local_16e0 = auVar2._0_8_;
        local_9e0 = local_16e0;
        uStack_16d8 = auVar2._8_8_;
        uStack_9d8 = uStack_16d8;
        uStack_16d0 = auVar2._16_8_;
        uStack_9d0 = uStack_16d0;
        uStack_16c8 = auVar2._24_8_;
        uStack_9c8 = uStack_16c8;
        local_120 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_e8 = local_120._0_8_;
        *(undefined8 *)(local_11f8 + 0x1a) = local_120._8_8_;
        *(undefined8 *)(local_11f8 + 0x1c) = local_120._16_8_;
        *(undefined8 *)(local_11f8 + 0x1e) = local_120._24_8_;
        local_1258 = local_1258 + 8;
        local_1260 = local_1260 + 8;
        local_1268 = local_1268 + 8;
        local_11f8 = local_11f8 + 0x20;
        local_760 = local_9a0;
        uStack_758 = uStack_998;
        uStack_750 = uStack_990;
        uStack_748 = uStack_988;
        local_6e0 = local_900;
        uStack_6d8 = uStack_8f8;
        uStack_6d0 = uStack_8f0;
        uStack_6c8 = uStack_8e8;
        local_620 = local_860;
        uStack_618 = uStack_858;
        uStack_610 = uStack_850;
        uStack_608 = uStack_848;
        local_560 = local_7a0;
        uStack_558 = uStack_798;
        uStack_550 = uStack_790;
        uStack_548 = uStack_788;
        local_4e0 = local_700;
        uStack_4d8 = uStack_6f8;
        uStack_4d0 = uStack_6f0;
        uStack_4c8 = uStack_6e8;
        local_420 = local_660;
        uStack_418 = uStack_658;
        uStack_410 = uStack_650;
        uStack_408 = uStack_648;
        local_3a0 = local_5a0;
        uStack_398 = uStack_598;
        uStack_390 = uStack_590;
        uStack_388 = uStack_588;
        local_300 = local_500;
        uStack_2f8 = uStack_4f8;
        uStack_2f0 = uStack_4f0;
        uStack_2e8 = uStack_4e8;
        local_260 = local_460;
        uStack_258 = uStack_458;
        uStack_250 = uStack_450;
        uStack_248 = uStack_448;
      }
      for (; local_1270 + 1 < local_119c; local_1270 = local_1270 + 2) {
        local_10c0 = local_1258;
        local_a00 = *(undefined8 *)*local_1258;
        uStack_9f8 = *(undefined8 *)(*local_1258 + 8);
        uStack_9f0 = *(undefined8 *)(*local_1258 + 0x10);
        uStack_9e8 = *(undefined8 *)(*local_1258 + 0x18);
        local_10c8 = local_1258 + 1;
        local_a20 = *(undefined8 *)*local_10c8;
        uStack_a18 = *(undefined8 *)(local_1258[1] + 8);
        uStack_a10 = *(undefined8 *)(local_1258[1] + 0x10);
        uStack_a08 = *(undefined8 *)(local_1258[1] + 0x18);
        local_10d0 = local_1258 + 2;
        local_c60 = *(undefined8 *)*local_10d0;
        uStack_c58 = *(undefined8 *)(local_1258[2] + 8);
        uStack_c50 = *(undefined8 *)(local_1258[2] + 0x10);
        uStack_c48 = *(undefined8 *)(local_1258[2] + 0x18);
        auVar5 = *local_10d0;
        local_10d8 = local_1260;
        local_aa0 = *(undefined8 *)*local_1260;
        uStack_a98 = *(undefined8 *)(*local_1260 + 8);
        uStack_a90 = *(undefined8 *)(*local_1260 + 0x10);
        uStack_a88 = *(undefined8 *)(*local_1260 + 0x18);
        local_10e0 = local_1260 + 1;
        local_ae0 = *(undefined8 *)*local_10e0;
        uStack_ad8 = *(undefined8 *)(local_1260[1] + 8);
        uStack_ad0 = *(undefined8 *)(local_1260[1] + 0x10);
        uStack_ac8 = *(undefined8 *)(local_1260[1] + 0x18);
        local_10e8 = local_1260 + 2;
        local_d00 = *(undefined8 *)*local_10e8;
        uStack_cf8 = *(undefined8 *)(local_1260[2] + 8);
        uStack_cf0 = *(undefined8 *)(local_1260[2] + 0x10);
        uStack_ce8 = *(undefined8 *)(local_1260[2] + 0x18);
        auVar8 = *local_10e8;
        local_10f0 = local_1268;
        local_b20 = *(undefined8 *)*local_1268;
        uStack_b18 = *(undefined8 *)(*local_1268 + 8);
        uStack_b10 = *(undefined8 *)(*local_1268 + 0x10);
        uStack_b08 = *(undefined8 *)(*local_1268 + 0x18);
        local_10f8 = local_1268 + 1;
        local_b60 = *(undefined8 *)*local_10f8;
        uStack_b58 = *(undefined8 *)(local_1268[1] + 8);
        uStack_b50 = *(undefined8 *)(local_1268[1] + 0x10);
        uStack_b48 = *(undefined8 *)(local_1268[1] + 0x18);
        local_1100 = local_1268 + 2;
        local_da0 = *(undefined8 *)*local_1100;
        uStack_d98 = *(undefined8 *)(local_1268[2] + 8);
        uStack_d90 = *(undefined8 *)(local_1268[2] + 0x10);
        uStack_d88 = *(undefined8 *)(local_1268[2] + 0x18);
        auVar11 = *local_1100;
        auVar1 = vmaxps_avx(*local_1258,*local_10c8);
        local_1820 = auVar1._0_8_;
        local_a40 = local_1820;
        uStack_1818 = auVar1._8_8_;
        uStack_a38 = uStack_1818;
        uStack_1810 = auVar1._16_8_;
        uStack_a30 = uStack_1810;
        uStack_1808 = auVar1._24_8_;
        uStack_a28 = uStack_1808;
        auVar1 = vmaxps_avx(auVar1,*local_10d0);
        local_1820 = auVar1._0_8_;
        local_a80 = local_1820;
        uStack_1818 = auVar1._8_8_;
        uStack_a78 = uStack_1818;
        uStack_1810 = auVar1._16_8_;
        uStack_a70 = uStack_1810;
        uStack_1808 = auVar1._24_8_;
        uStack_a68 = uStack_1808;
        auVar1 = vmaxps_avx(auVar1,*local_1260);
        local_1820 = auVar1._0_8_;
        local_ac0 = local_1820;
        uStack_1818 = auVar1._8_8_;
        uStack_ab8 = uStack_1818;
        uStack_1810 = auVar1._16_8_;
        uStack_ab0 = uStack_1810;
        uStack_1808 = auVar1._24_8_;
        uStack_aa8 = uStack_1808;
        auVar1 = vmaxps_avx(auVar1,*local_10e0);
        auVar2 = vmaxps_avx(*local_10e8,*local_1268);
        local_1840 = auVar2._0_8_;
        local_b40 = local_1840;
        uStack_1838 = auVar2._8_8_;
        uStack_b38 = uStack_1838;
        uStack_1830 = auVar2._16_8_;
        uStack_b30 = uStack_1830;
        uStack_1828 = auVar2._24_8_;
        uStack_b28 = uStack_1828;
        auVar2 = vmaxps_avx(auVar2,*local_10f8);
        local_1840 = auVar2._0_8_;
        local_b80 = local_1840;
        uStack_1838 = auVar2._8_8_;
        uStack_b78 = uStack_1838;
        uStack_1830 = auVar2._16_8_;
        uStack_b70 = uStack_1830;
        uStack_1828 = auVar2._24_8_;
        uStack_b68 = uStack_1828;
        auVar2 = vmaxps_avx(auVar2,*local_1100);
        local_1108 = local_1258 + 3;
        local_c00 = *(undefined8 *)*local_1108;
        uStack_bf8 = *(undefined8 *)(local_1258[3] + 8);
        uStack_bf0 = *(undefined8 *)(local_1258[3] + 0x10);
        uStack_be8 = *(undefined8 *)(local_1258[3] + 0x18);
        auVar3 = *local_1108;
        local_1110 = local_1258 + 4;
        local_c20 = *(undefined8 *)*local_1110;
        uStack_c18 = *(undefined8 *)(local_1258[4] + 8);
        uStack_c10 = *(undefined8 *)(local_1258[4] + 0x10);
        uStack_c08 = *(undefined8 *)(local_1258[4] + 0x18);
        auVar4 = *local_1110;
        local_1118 = local_1260 + 3;
        local_ca0 = *(undefined8 *)*local_1118;
        uStack_c98 = *(undefined8 *)(local_1260[3] + 8);
        uStack_c90 = *(undefined8 *)(local_1260[3] + 0x10);
        uStack_c88 = *(undefined8 *)(local_1260[3] + 0x18);
        auVar6 = *local_1118;
        local_1120 = local_1260 + 4;
        local_ce0 = *(undefined8 *)*local_1120;
        uStack_cd8 = *(undefined8 *)(local_1260[4] + 8);
        uStack_cd0 = *(undefined8 *)(local_1260[4] + 0x10);
        uStack_cc8 = *(undefined8 *)(local_1260[4] + 0x18);
        auVar7 = *local_1120;
        local_1128 = local_1268 + 3;
        local_d20 = *(undefined8 *)*local_1128;
        uStack_d18 = *(undefined8 *)(local_1268[3] + 8);
        uStack_d10 = *(undefined8 *)(local_1268[3] + 0x10);
        uStack_d08 = *(undefined8 *)(local_1268[3] + 0x18);
        auVar9 = *local_1128;
        local_1130 = local_1268 + 4;
        local_d60 = *(undefined8 *)*local_1130;
        uStack_d58 = *(undefined8 *)(local_1268[4] + 8);
        uStack_d50 = *(undefined8 *)(local_1268[4] + 0x10);
        uStack_d48 = *(undefined8 *)(local_1268[4] + 0x18);
        auVar10 = *local_1130;
        local_128 = local_11f8;
        local_1820 = auVar1._0_8_;
        local_bc0 = local_1820;
        uStack_1818 = auVar1._8_8_;
        uStack_bb8 = uStack_1818;
        uStack_1810 = auVar1._16_8_;
        uStack_bb0 = uStack_1810;
        uStack_1808 = auVar1._24_8_;
        uStack_ba8 = uStack_1808;
        local_1840 = auVar2._0_8_;
        local_be0 = local_1840;
        uStack_1838 = auVar2._8_8_;
        uStack_bd8 = uStack_1838;
        uStack_1830 = auVar2._16_8_;
        uStack_bd0 = uStack_1830;
        uStack_1828 = auVar2._24_8_;
        uStack_bc8 = uStack_1828;
        local_160 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_11f8 = local_160._0_8_;
        *(undefined8 *)(local_11f8 + 2) = local_160._8_8_;
        *(undefined8 *)(local_11f8 + 4) = local_160._16_8_;
        *(undefined8 *)(local_11f8 + 6) = local_160._24_8_;
        auVar1 = vmaxps_avx(auVar3,auVar4);
        local_1920 = auVar1._0_8_;
        local_c40 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_c38 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_c30 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_c28 = uStack_1908;
        auVar1 = vmaxps_avx(auVar1,auVar5);
        local_1920 = auVar1._0_8_;
        local_c80 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_c78 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_c70 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_c68 = uStack_1908;
        auVar1 = vmaxps_avx(auVar1,auVar6);
        local_1920 = auVar1._0_8_;
        local_cc0 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_cb8 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_cb0 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_ca8 = uStack_1908;
        auVar1 = vmaxps_avx(auVar1,auVar7);
        auVar2 = vmaxps_avx(auVar8,auVar9);
        local_1920 = auVar1._0_8_;
        local_d40 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_d38 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_d30 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_d28 = uStack_1908;
        auVar1 = vmaxps_avx(auVar1,auVar10);
        local_1920 = auVar1._0_8_;
        local_d80 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_d78 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_d70 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_d68 = uStack_1908;
        auVar1 = vmaxps_avx(auVar1,auVar11);
        local_168 = local_11f8 + 8;
        local_1920 = auVar1._0_8_;
        local_dc0 = local_1920;
        uStack_1918 = auVar1._8_8_;
        uStack_db8 = uStack_1918;
        uStack_1910 = auVar1._16_8_;
        uStack_db0 = uStack_1910;
        uStack_1908 = auVar1._24_8_;
        uStack_da8 = uStack_1908;
        local_1940 = auVar2._0_8_;
        local_de0 = local_1940;
        uStack_1938 = auVar2._8_8_;
        uStack_dd8 = uStack_1938;
        uStack_1930 = auVar2._16_8_;
        uStack_dd0 = uStack_1930;
        uStack_1928 = auVar2._24_8_;
        uStack_dc8 = uStack_1928;
        local_1a0 = vmaxps_avx(auVar1,auVar2);
        *(undefined8 *)local_168 = local_1a0._0_8_;
        *(undefined8 *)(local_11f8 + 10) = local_1a0._8_8_;
        *(undefined8 *)(local_11f8 + 0xc) = local_1a0._16_8_;
        *(undefined8 *)(local_11f8 + 0xe) = local_1a0._24_8_;
        local_1258 = local_1258 + 4;
        local_1260 = local_1260 + 4;
        local_1268 = local_1268 + 4;
        local_11f8 = local_11f8 + 0x10;
        local_ba0 = local_da0;
        uStack_b98 = uStack_d98;
        uStack_b90 = uStack_d90;
        uStack_b88 = uStack_d88;
        local_b00 = local_d00;
        uStack_af8 = uStack_cf8;
        uStack_af0 = uStack_cf0;
        uStack_ae8 = uStack_ce8;
        local_a60 = local_c60;
        uStack_a58 = uStack_c58;
        uStack_a50 = uStack_c50;
        uStack_a48 = uStack_c48;
      }
      for (; local_1270 < local_119c; local_1270 = local_1270 + 1) {
        local_1138 = local_1258;
        local_e00 = *(undefined8 *)*local_1258;
        uStack_df8 = *(undefined8 *)(*local_1258 + 8);
        uStack_df0 = *(undefined8 *)(*local_1258 + 0x10);
        uStack_de8 = *(undefined8 *)(*local_1258 + 0x18);
        local_1140 = local_1258 + 1;
        local_e20 = *(undefined8 *)*local_1140;
        uStack_e18 = *(undefined8 *)(local_1258[1] + 8);
        uStack_e10 = *(undefined8 *)(local_1258[1] + 0x10);
        uStack_e08 = *(undefined8 *)(local_1258[1] + 0x18);
        local_1148 = local_1258 + 2;
        local_e60 = *(undefined8 *)*local_1148;
        uStack_e58 = *(undefined8 *)(local_1258[2] + 8);
        uStack_e50 = *(undefined8 *)(local_1258[2] + 0x10);
        uStack_e48 = *(undefined8 *)(local_1258[2] + 0x18);
        local_1150 = local_1260;
        local_ea0 = *(undefined8 *)*local_1260;
        uStack_e98 = *(undefined8 *)(*local_1260 + 8);
        uStack_e90 = *(undefined8 *)(*local_1260 + 0x10);
        uStack_e88 = *(undefined8 *)(*local_1260 + 0x18);
        local_1158 = local_1260 + 1;
        local_ee0 = *(undefined8 *)*local_1158;
        uStack_ed8 = *(undefined8 *)(local_1260[1] + 8);
        uStack_ed0 = *(undefined8 *)(local_1260[1] + 0x10);
        uStack_ec8 = *(undefined8 *)(local_1260[1] + 0x18);
        local_1160 = local_1260 + 2;
        local_f00 = *(undefined8 *)*local_1160;
        uStack_ef8 = *(undefined8 *)(local_1260[2] + 8);
        uStack_ef0 = *(undefined8 *)(local_1260[2] + 0x10);
        uStack_ee8 = *(undefined8 *)(local_1260[2] + 0x18);
        local_1168 = local_1268;
        local_f20 = *(undefined8 *)*local_1268;
        uStack_f18 = *(undefined8 *)(*local_1268 + 8);
        uStack_f10 = *(undefined8 *)(*local_1268 + 0x10);
        uStack_f08 = *(undefined8 *)(*local_1268 + 0x18);
        local_1170 = local_1268 + 1;
        local_f60 = *(undefined8 *)*local_1170;
        uStack_f58 = *(undefined8 *)(local_1268[1] + 8);
        uStack_f50 = *(undefined8 *)(local_1268[1] + 0x10);
        uStack_f48 = *(undefined8 *)(local_1268[1] + 0x18);
        local_1178 = local_1268 + 2;
        local_fa0 = *(undefined8 *)*local_1178;
        uStack_f98 = *(undefined8 *)(local_1268[2] + 8);
        uStack_f90 = *(undefined8 *)(local_1268[2] + 0x10);
        uStack_f88 = *(undefined8 *)(local_1268[2] + 0x18);
        auVar1 = vmaxps_avx(*local_1258,*local_1140);
        local_1a80 = auVar1._0_8_;
        local_e40 = local_1a80;
        uStack_1a78 = auVar1._8_8_;
        uStack_e38 = uStack_1a78;
        uStack_1a70 = auVar1._16_8_;
        uStack_e30 = uStack_1a70;
        uStack_1a68 = auVar1._24_8_;
        uStack_e28 = uStack_1a68;
        auVar1 = vmaxps_avx(auVar1,*local_1148);
        local_1a80 = auVar1._0_8_;
        local_e80 = local_1a80;
        uStack_1a78 = auVar1._8_8_;
        uStack_e78 = uStack_1a78;
        uStack_1a70 = auVar1._16_8_;
        uStack_e70 = uStack_1a70;
        uStack_1a68 = auVar1._24_8_;
        uStack_e68 = uStack_1a68;
        auVar1 = vmaxps_avx(auVar1,*local_1260);
        local_1a80 = auVar1._0_8_;
        local_ec0 = local_1a80;
        uStack_1a78 = auVar1._8_8_;
        uStack_eb8 = uStack_1a78;
        uStack_1a70 = auVar1._16_8_;
        uStack_eb0 = uStack_1a70;
        uStack_1a68 = auVar1._24_8_;
        uStack_ea8 = uStack_1a68;
        auVar1 = vmaxps_avx(auVar1,*local_1158);
        auVar2 = vmaxps_avx(*local_1160,*local_1268);
        local_1aa0 = auVar2._0_8_;
        local_f40 = local_1aa0;
        uVar16 = auVar2._8_8_;
        uStack_f38 = uVar16;
        this = auVar2._16_8_;
        uStack_f30 = this;
        uStack_1a88 = auVar2._24_8_;
        uStack_f28 = uStack_1a88;
        auVar2 = vmaxps_avx(auVar2,*local_1170);
        local_1aa0 = auVar2._0_8_;
        local_f80 = local_1aa0;
        uVar16 = auVar2._8_8_;
        uStack_f78 = uVar16;
        this = auVar2._16_8_;
        uStack_f70 = this;
        uStack_1a88 = auVar2._24_8_;
        uStack_f68 = uStack_1a88;
        _local_1aa0 = vmaxps_avx(auVar2,*local_1178);
        local_1a8 = local_11f8;
        local_1a80 = auVar1._0_8_;
        local_fc0 = local_1a80;
        uStack_1a78 = auVar1._8_8_;
        uStack_fb8 = uStack_1a78;
        uStack_1a70 = auVar1._16_8_;
        uStack_fb0 = uStack_1a70;
        uStack_1a68 = auVar1._24_8_;
        uStack_fa8 = uStack_1a68;
        local_fe0 = local_1aa0;
        uStack_fc8 = uStack_1a88;
        local_1e0 = vmaxps_avx(auVar1,_local_1aa0);
        *(undefined8 *)local_11f8 = local_1e0._0_8_;
        *(undefined8 *)(local_11f8 + 2) = local_1e0._8_8_;
        *(undefined8 *)(local_11f8 + 4) = local_1e0._16_8_;
        *(undefined8 *)(local_11f8 + 6) = local_1e0._24_8_;
        local_1258 = local_1258 + 2;
        local_1260 = local_1260 + 2;
        local_1268 = local_1268 + 2;
        local_11f8 = local_11f8 + 8;
        uStack_fd8 = uVar16;
        uStack_fd0 = this;
      }
      local_1258 = (undefined1 (*) [32])(*local_1258 + (long)local_11a4 * 4);
      local_1260 = (undefined1 (*) [32])(*local_1260 + (long)local_11a4 * 4);
      local_1268 = (undefined1 (*) [32])(*local_1268 + (long)local_11a4 * 4);
    }
    Mat::~Mat((Mat *)0x4c6524);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                __m256 _max20 = _mm256_max_ps(_r05, _r06);
                _max20 = _mm256_max_ps(_max20, _r04);
                _max20 = _mm256_max_ps(_max20, _r15);
                _max20 = _mm256_max_ps(_max20, _r16);
                __m256 _max21 = _mm256_max_ps(_r14, _r25);
                _max20 = _mm256_max_ps(_max20, _r26);
                _max20 = _mm256_max_ps(_max20, _r24);

                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);

                _mm256_storeu_ps(outptr + 16, _mm256_max_ps(_max20, _max21));

                __m256 _max30 = _mm256_max_ps(_r07, _r08);
                _max30 = _mm256_max_ps(_max30, _r06);
                _max30 = _mm256_max_ps(_max30, _r17);
                _max30 = _mm256_max_ps(_max30, _r18);
                __m256 _max31 = _mm256_max_ps(_r16, _r27);
                _max30 = _mm256_max_ps(_max30, _r28);
                _max30 = _mm256_max_ps(_max30, _r26);

                _mm256_storeu_ps(outptr + 24, _mm256_max_ps(_max30, _max31));

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr += 16;
            }

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                _max0 = _mm256_max_ps(_max0, _r02);
                _max0 = _mm256_max_ps(_max0, _r10);
                _max0 = _mm256_max_ps(_max0, _r11);
                __m256 _max1 = _mm256_max_ps(_r12, _r20);
                _max1 = _mm256_max_ps(_max1, _r21);
                _max1 = _mm256_max_ps(_max1, _r22);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max0, _max1));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}